

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void __thiscall duckdb::UpdateSegment::UpdateSegment(UpdateSegment *this,ColumnData *column_data)

{
  PhysicalType type;
  int iVar1;
  Allocator *allocator;
  idx_t iVar2;
  NotImplementedException *pNVar3;
  code *pcVar4;
  string local_68;
  LogicalType local_48;
  
  this->column_data = column_data;
  StorageLock::StorageLock(&this->lock);
  (this->root).super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
  super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl = (UpdateNode *)0x0;
  LogicalType::LogicalType(&local_48,&column_data->type);
  SegmentStatistics::SegmentStatistics(&this->stats,&local_48);
  LogicalType::~LogicalType(&local_48);
  *(undefined8 *)((long)&(this->stats_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->stats_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->stats_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->stats_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->stats_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  allocator = BufferAllocator::Get(column_data->info->db->db);
  StringHeap::StringHeap(&this->heap,allocator);
  type = (column_data->type).physical_type_;
  iVar2 = GetTypeIdSize(type);
  this->type_size = iVar2;
  iVar1 = type - 1;
  switch(iVar1) {
  case 0:
  case 2:
    pcVar4 = InitializeUpdateData<signed_char>;
    break;
  case 1:
    pcVar4 = InitializeUpdateData<unsigned_char>;
    break;
  case 3:
    pcVar4 = InitializeUpdateData<unsigned_short>;
    break;
  case 4:
    pcVar4 = InitializeUpdateData<short>;
    break;
  case 5:
    pcVar4 = InitializeUpdateData<unsigned_int>;
    break;
  case 6:
    pcVar4 = InitializeUpdateData<int>;
    break;
  case 7:
    pcVar4 = InitializeUpdateData<unsigned_long>;
    break;
  case 8:
    pcVar4 = InitializeUpdateData<long>;
    break;
  case 9:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_00614dc3_caseD_9:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unimplemented type for update segment","");
    NotImplementedException::NotImplementedException(pNVar3,&local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    pcVar4 = InitializeUpdateData<float>;
    break;
  case 0xb:
    pcVar4 = InitializeUpdateData<double>;
    break;
  case 0x14:
    pcVar4 = InitializeUpdateData<duckdb::interval_t>;
    break;
  default:
    switch(type) {
    case VARCHAR:
      pcVar4 = InitializeUpdateData<duckdb::string_t>;
      break;
    default:
      goto switchD_00614dc3_caseD_9;
    case UINT128:
      pcVar4 = InitializeUpdateData<duckdb::uhugeint_t>;
      break;
    case INT128:
      pcVar4 = InitializeUpdateData<duckdb::hugeint_t>;
      break;
    case BIT:
      pcVar4 = InitializeUpdateValidity;
    }
  }
  this->initialize_update_function = pcVar4;
  switch(iVar1) {
  case 0:
  case 2:
    pcVar4 = UpdateMergeFetch<signed_char>;
    break;
  case 1:
    pcVar4 = UpdateMergeFetch<unsigned_char>;
    break;
  case 3:
    pcVar4 = UpdateMergeFetch<unsigned_short>;
    break;
  case 4:
    pcVar4 = UpdateMergeFetch<short>;
    break;
  case 5:
    pcVar4 = UpdateMergeFetch<unsigned_int>;
    break;
  case 6:
    pcVar4 = UpdateMergeFetch<int>;
    break;
  case 7:
    pcVar4 = UpdateMergeFetch<unsigned_long>;
    break;
  case 8:
    pcVar4 = UpdateMergeFetch<long>;
    break;
  case 9:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_00614e87_caseD_9:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unimplemented type for update segment","");
    NotImplementedException::NotImplementedException(pNVar3,&local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    pcVar4 = UpdateMergeFetch<float>;
    break;
  case 0xb:
    pcVar4 = UpdateMergeFetch<double>;
    break;
  case 0x14:
    pcVar4 = UpdateMergeFetch<duckdb::interval_t>;
    break;
  default:
    switch(type) {
    case VARCHAR:
      pcVar4 = UpdateMergeFetch<duckdb::string_t>;
      break;
    default:
      goto switchD_00614e87_caseD_9;
    case UINT128:
      pcVar4 = UpdateMergeFetch<duckdb::uhugeint_t>;
      break;
    case INT128:
      pcVar4 = UpdateMergeFetch<duckdb::hugeint_t>;
      break;
    case BIT:
      pcVar4 = UpdateMergeValidity;
    }
  }
  this->fetch_update_function = pcVar4;
  switch(iVar1) {
  case 0:
  case 2:
    pcVar4 = TemplatedFetchCommitted<signed_char>;
    break;
  case 1:
    pcVar4 = TemplatedFetchCommitted<unsigned_char>;
    break;
  case 3:
    pcVar4 = TemplatedFetchCommitted<unsigned_short>;
    break;
  case 4:
    pcVar4 = TemplatedFetchCommitted<short>;
    break;
  case 5:
    pcVar4 = TemplatedFetchCommitted<unsigned_int>;
    break;
  case 6:
    pcVar4 = TemplatedFetchCommitted<int>;
    break;
  case 7:
    pcVar4 = TemplatedFetchCommitted<unsigned_long>;
    break;
  case 8:
    pcVar4 = TemplatedFetchCommitted<long>;
    break;
  case 9:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_00614f4b_caseD_9:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unimplemented type for update segment","");
    NotImplementedException::NotImplementedException(pNVar3,&local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    pcVar4 = TemplatedFetchCommitted<float>;
    break;
  case 0xb:
    pcVar4 = TemplatedFetchCommitted<double>;
    break;
  case 0x14:
    pcVar4 = TemplatedFetchCommitted<duckdb::interval_t>;
    break;
  default:
    switch(type) {
    case VARCHAR:
      pcVar4 = TemplatedFetchCommitted<duckdb::string_t>;
      break;
    default:
      goto switchD_00614f4b_caseD_9;
    case UINT128:
      pcVar4 = TemplatedFetchCommitted<duckdb::uhugeint_t>;
      break;
    case INT128:
      pcVar4 = TemplatedFetchCommitted<duckdb::hugeint_t>;
      break;
    case BIT:
      pcVar4 = FetchCommittedValidity;
    }
  }
  this->fetch_committed_function = pcVar4;
  switch(iVar1) {
  case 0:
  case 2:
    pcVar4 = TemplatedFetchCommittedRange<signed_char>;
    break;
  case 1:
    pcVar4 = TemplatedFetchCommittedRange<unsigned_char>;
    break;
  case 3:
    pcVar4 = TemplatedFetchCommittedRange<unsigned_short>;
    break;
  case 4:
    pcVar4 = TemplatedFetchCommittedRange<short>;
    break;
  case 5:
    pcVar4 = TemplatedFetchCommittedRange<unsigned_int>;
    break;
  case 6:
    pcVar4 = TemplatedFetchCommittedRange<int>;
    break;
  case 7:
    pcVar4 = TemplatedFetchCommittedRange<unsigned_long>;
    break;
  case 8:
    pcVar4 = TemplatedFetchCommittedRange<long>;
    break;
  case 9:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_0061500f_caseD_9:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unimplemented type for update segment","");
    NotImplementedException::NotImplementedException(pNVar3,&local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    pcVar4 = TemplatedFetchCommittedRange<float>;
    break;
  case 0xb:
    pcVar4 = TemplatedFetchCommittedRange<double>;
    break;
  case 0x14:
    pcVar4 = TemplatedFetchCommittedRange<duckdb::interval_t>;
    break;
  default:
    switch(type) {
    case VARCHAR:
      pcVar4 = TemplatedFetchCommittedRange<duckdb::string_t>;
      break;
    default:
      goto switchD_0061500f_caseD_9;
    case UINT128:
      pcVar4 = TemplatedFetchCommittedRange<duckdb::uhugeint_t>;
      break;
    case INT128:
      pcVar4 = TemplatedFetchCommittedRange<duckdb::hugeint_t>;
      break;
    case BIT:
      pcVar4 = FetchCommittedRangeValidity;
    }
  }
  this->fetch_committed_range = pcVar4;
  switch(iVar1) {
  case 0:
  case 2:
    pcVar4 = TemplatedFetchRow<signed_char>;
    break;
  case 1:
    pcVar4 = TemplatedFetchRow<unsigned_char>;
    break;
  case 3:
    pcVar4 = TemplatedFetchRow<unsigned_short>;
    break;
  case 4:
    pcVar4 = TemplatedFetchRow<short>;
    break;
  case 5:
    pcVar4 = TemplatedFetchRow<unsigned_int>;
    break;
  case 6:
    pcVar4 = TemplatedFetchRow<int>;
    break;
  case 7:
    pcVar4 = TemplatedFetchRow<unsigned_long>;
    break;
  case 8:
    pcVar4 = TemplatedFetchRow<long>;
    break;
  case 9:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_006150d3_caseD_9:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unimplemented type for update segment fetch row","");
    NotImplementedException::NotImplementedException(pNVar3,&local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    pcVar4 = TemplatedFetchRow<float>;
    break;
  case 0xb:
    pcVar4 = TemplatedFetchRow<double>;
    break;
  case 0x14:
    pcVar4 = TemplatedFetchRow<duckdb::interval_t>;
    break;
  default:
    switch(type) {
    case VARCHAR:
      pcVar4 = TemplatedFetchRow<duckdb::string_t>;
      break;
    default:
      goto switchD_006150d3_caseD_9;
    case UINT128:
      pcVar4 = TemplatedFetchRow<duckdb::uhugeint_t>;
      break;
    case INT128:
      pcVar4 = TemplatedFetchRow<duckdb::hugeint_t>;
      break;
    case BIT:
      pcVar4 = FetchRowValidity;
    }
  }
  this->fetch_row_function = pcVar4;
  switch(iVar1) {
  case 0:
  case 2:
    pcVar4 = MergeUpdateLoop<signed_char>;
    break;
  case 1:
    pcVar4 = MergeUpdateLoop<unsigned_char>;
    break;
  case 3:
    pcVar4 = MergeUpdateLoop<unsigned_short>;
    break;
  case 4:
    pcVar4 = MergeUpdateLoop<short>;
    break;
  case 5:
    pcVar4 = MergeUpdateLoop<unsigned_int>;
    break;
  case 6:
    pcVar4 = MergeUpdateLoop<int>;
    break;
  case 7:
    pcVar4 = MergeUpdateLoop<unsigned_long>;
    break;
  case 8:
    pcVar4 = MergeUpdateLoop<long>;
    break;
  case 9:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_00615197_caseD_9:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unimplemented type for uncompressed segment","");
    NotImplementedException::NotImplementedException(pNVar3,&local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    pcVar4 = MergeUpdateLoop<float>;
    break;
  case 0xb:
    pcVar4 = MergeUpdateLoop<double>;
    break;
  case 0x14:
    pcVar4 = MergeUpdateLoop<duckdb::interval_t>;
    break;
  default:
    switch(type) {
    case VARCHAR:
      pcVar4 = MergeUpdateLoop<duckdb::string_t>;
      break;
    default:
      goto switchD_00615197_caseD_9;
    case UINT128:
      pcVar4 = MergeUpdateLoop<duckdb::uhugeint_t>;
      break;
    case INT128:
      pcVar4 = MergeUpdateLoop<duckdb::hugeint_t>;
      break;
    case BIT:
      pcVar4 = MergeValidityLoop;
    }
  }
  this->merge_update_function = pcVar4;
  switch(iVar1) {
  case 0:
  case 2:
    pcVar4 = RollbackUpdate<signed_char>;
    break;
  case 1:
    pcVar4 = RollbackUpdate<unsigned_char>;
    break;
  case 3:
    pcVar4 = RollbackUpdate<unsigned_short>;
    break;
  case 4:
    pcVar4 = RollbackUpdate<short>;
    break;
  case 5:
    pcVar4 = RollbackUpdate<unsigned_int>;
    break;
  case 6:
    pcVar4 = RollbackUpdate<int>;
    break;
  case 7:
    pcVar4 = RollbackUpdate<unsigned_long>;
    break;
  case 8:
    pcVar4 = RollbackUpdate<long>;
    break;
  case 9:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_0061525b_caseD_9:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unimplemented type for uncompressed segment","");
    NotImplementedException::NotImplementedException(pNVar3,&local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    pcVar4 = RollbackUpdate<float>;
    break;
  case 0xb:
    pcVar4 = RollbackUpdate<double>;
    break;
  case 0x14:
    pcVar4 = RollbackUpdate<duckdb::interval_t>;
    break;
  default:
    switch(type) {
    case VARCHAR:
      pcVar4 = RollbackUpdate<duckdb::string_t>;
      break;
    default:
      goto switchD_0061525b_caseD_9;
    case UINT128:
      pcVar4 = RollbackUpdate<duckdb::uhugeint_t>;
      break;
    case INT128:
      pcVar4 = RollbackUpdate<duckdb::hugeint_t>;
      break;
    case BIT:
      pcVar4 = RollbackUpdate<bool>;
    }
  }
  this->rollback_update_function = pcVar4;
  switch(iVar1) {
  case 0:
  case 2:
    pcVar4 = TemplatedUpdateNumericStatistics<signed_char>;
    break;
  case 1:
    pcVar4 = TemplatedUpdateNumericStatistics<unsigned_char>;
    break;
  case 3:
    pcVar4 = TemplatedUpdateNumericStatistics<unsigned_short>;
    break;
  case 4:
    pcVar4 = TemplatedUpdateNumericStatistics<short>;
    break;
  case 5:
    pcVar4 = TemplatedUpdateNumericStatistics<unsigned_int>;
    break;
  case 6:
    pcVar4 = TemplatedUpdateNumericStatistics<int>;
    break;
  case 7:
    pcVar4 = TemplatedUpdateNumericStatistics<unsigned_long>;
    break;
  case 8:
    pcVar4 = TemplatedUpdateNumericStatistics<long>;
    break;
  case 9:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_0061531f_caseD_9:
    pNVar3 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unimplemented type for uncompressed segment","");
    NotImplementedException::NotImplementedException(pNVar3,&local_68);
    __cxa_throw(pNVar3,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    pcVar4 = TemplatedUpdateNumericStatistics<float>;
    break;
  case 0xb:
    pcVar4 = TemplatedUpdateNumericStatistics<double>;
    break;
  case 0x14:
    pcVar4 = TemplatedUpdateNumericStatistics<duckdb::interval_t>;
    break;
  default:
    switch(type) {
    case VARCHAR:
      pcVar4 = UpdateStringStatistics;
      break;
    default:
      goto switchD_0061531f_caseD_9;
    case UINT128:
      pcVar4 = TemplatedUpdateNumericStatistics<duckdb::uhugeint_t>;
      break;
    case INT128:
      pcVar4 = TemplatedUpdateNumericStatistics<duckdb::hugeint_t>;
      break;
    case BIT:
      pcVar4 = UpdateValidityStatistics;
    }
  }
  this->statistics_update_function = pcVar4;
  return;
}

Assistant:

UpdateSegment::UpdateSegment(ColumnData &column_data)
    : column_data(column_data), stats(column_data.type), heap(BufferAllocator::Get(column_data.GetDatabase())) {
	auto physical_type = column_data.type.InternalType();

	this->type_size = GetTypeIdSize(physical_type);

	this->initialize_update_function = GetInitializeUpdateFunction(physical_type);
	this->fetch_update_function = GetFetchUpdateFunction(physical_type);
	this->fetch_committed_function = GetFetchCommittedFunction(physical_type);
	this->fetch_committed_range = GetFetchCommittedRangeFunction(physical_type);
	this->fetch_row_function = GetFetchRowFunction(physical_type);
	this->merge_update_function = GetMergeUpdateFunction(physical_type);
	this->rollback_update_function = GetRollbackUpdateFunction(physical_type);
	this->statistics_update_function = GetStatisticsUpdateFunction(physical_type);
}